

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void randomFunc(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  sqlite_int64 in_RAX;
  long val;
  sqlite_int64 r;
  
  r = in_RAX;
  sqlite3_randomness(8,&r);
  val = -(r & 0x7fffffffffffffffU);
  if (-1 < r) {
    val = r;
  }
  sqlite3VdbeMemSetInt64(&context->s,val);
  return;
}

Assistant:

static void randomFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite_int64 r;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_randomness(sizeof(r), &r);
  if( r<0 ){
    /* We need to prevent a random number of 0x8000000000000000 
    ** (or -9223372036854775808) since when you do abs() of that
    ** number of you get the same value back again.  To do this
    ** in a way that is testable, mask the sign bit off of negative
    ** values, resulting in a positive value.  Then take the 
    ** 2s complement of that positive value.  The end result can
    ** therefore be no less than -9223372036854775807.
    */
    r = -(r & LARGEST_INT64);
  }
  sqlite3_result_int64(context, r);
}